

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

int __thiscall Minisat::Solver::getRestartLevel(Solver *this)

{
  double dVar1;
  vec<double> *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  int *piVar8;
  Lit *pLVar9;
  double *pdVar10;
  Solver *in_RDI;
  int thisPropSize;
  Var more;
  int i;
  vec<double> *restart_activity;
  int restartLevel;
  Var next;
  bool repeatReusedTrail;
  Solver *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff54;
  int local_a8;
  int in_stack_ffffffffffffff5c;
  Heap<Minisat::Solver::VarOrderLt> *in_stack_ffffffffffffff60;
  vec<double> *local_68;
  vec<double> *local_60;
  int local_54;
  lbool local_3a;
  uint8_t local_39;
  int local_38;
  int local_34;
  int local_30;
  lbool local_2a;
  uint8_t local_29;
  vec<double> *local_28;
  int local_1c;
  uint3 in_stack_ffffffffffffffec;
  uint bLevel;
  Solver *this_01;
  int local_4;
  
  if ((in_RDI->restart).selection_type == 3) {
    local_4 = decisionLevel((Solver *)0x135a9f);
  }
  else if ((in_RDI->restart).selection_type == 4) {
    iVar4 = decisionLevel((Solver *)0x135ac3);
    if (iVar4 == 0) {
      local_54 = 0;
    }
    else {
      local_54 = rand();
      iVar4 = decisionLevel((Solver *)0x135ae3);
      local_54 = local_54 % iVar4;
    }
    local_4 = local_54;
  }
  else if ((in_RDI->restart).selection_type == 0) {
    local_4 = 0;
  }
  else {
    bLevel = (uint)in_stack_ffffffffffffffec;
    iVar4 = -1;
    local_1c = 0;
    this_01 = in_RDI;
    bVar2 = usesVSIDS(in_RDI);
    if (bVar2) {
      local_60 = &in_RDI->activity_VSIDS;
    }
    else {
      bVar2 = usesCHB(in_RDI);
      if (bVar2) {
        local_68 = &in_RDI->activity_CHB;
      }
      else {
        local_68 = &in_RDI->activity_distance;
      }
      local_60 = local_68;
    }
    local_28 = local_60;
    do {
      bLevel = bLevel & 0xffffff;
      while( true ) {
        bVar2 = true;
        if (iVar4 != -1) {
          local_29 = (uint8_t)value(in_stack_ffffffffffffff48,0);
          lbool::lbool(&local_2a,'\x02');
          bVar3 = lbool::operator!=((lbool *)in_stack_ffffffffffffff48,
                                    (lbool)(uint8_t)((uint)in_stack_ffffffffffffff54 >> 0x18));
          bVar2 = true;
          if (!bVar3) {
            pcVar7 = vec<char>::operator[](&in_RDI->decision,iVar4);
            bVar2 = *pcVar7 == '\0';
          }
        }
        if (!bVar2) break;
        bVar2 = Heap<Minisat::Solver::VarOrderLt>::empty
                          ((Heap<Minisat::Solver::VarOrderLt> *)0x135c3e);
        if (bVar2) {
          return 0;
        }
        iVar4 = Heap<Minisat::Solver::VarOrderLt>::removeMin(in_stack_ffffffffffffff60);
      }
      local_1c = 0;
      for (local_30 = 0; iVar6 = local_30, iVar5 = decisionLevel((Solver *)0x135c9c),
          this_00 = local_28, iVar6 < iVar5; local_30 = local_30 + 1) {
        piVar8 = vec<int>::operator[](&in_RDI->trail_lim,local_30);
        pLVar9 = vec<Minisat::Lit>::operator[](&in_RDI->trail,*piVar8);
        local_34 = pLVar9->x;
        iVar6 = var((Lit)local_34);
        pdVar10 = vec<double>::operator[](this_00,iVar6);
        dVar1 = *pdVar10;
        pdVar10 = vec<double>::operator[](local_28,iVar4);
        if (dVar1 < *pdVar10) {
          local_1c = local_30;
          break;
        }
      }
      Heap<Minisat::Solver::VarOrderLt>::insert(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
      ;
      if ((1 < (in_RDI->restart).selection_type) && (0 < local_1c)) {
        cancelUntil(this_01,bLevel,SUB41((uint)iVar4 >> 0x18,0));
        local_38 = -1;
        while( true ) {
          bVar2 = true;
          if (local_38 != -1) {
            local_39 = (uint8_t)value(in_stack_ffffffffffffff48,0);
            lbool::lbool(&local_3a,'\x02');
            bVar3 = lbool::operator!=((lbool *)in_stack_ffffffffffffff48,
                                      (lbool)(uint8_t)((uint)in_stack_ffffffffffffff54 >> 0x18));
            bVar2 = true;
            if (!bVar3) {
              pcVar7 = vec<char>::operator[](&in_RDI->decision,local_38);
              bVar2 = *pcVar7 == '\0';
            }
          }
          if (!bVar2) goto LAB_00135e75;
          bVar2 = Heap<Minisat::Solver::VarOrderLt>::empty
                            ((Heap<Minisat::Solver::VarOrderLt> *)0x135e45);
          if (bVar2) break;
          local_38 = Heap<Minisat::Solver::VarOrderLt>::removeMin(in_stack_ffffffffffffff60);
        }
        local_38 = -1;
LAB_00135e75:
        if (local_38 != -1) {
          pdVar10 = vec<double>::operator[](local_28,local_38);
          dVar1 = *pdVar10;
          in_stack_ffffffffffffff60 = (Heap<Minisat::Solver::VarOrderLt> *)&in_RDI->trail;
          piVar8 = vec<int>::operator[](&in_RDI->trail_lim,local_1c + -1);
          pLVar9 = vec<Minisat::Lit>::operator[]
                             ((vec<Minisat::Lit> *)in_stack_ffffffffffffff60,*piVar8);
          iVar6 = var((Lit)pLVar9->x);
          if ((double)iVar6 < dVar1) {
            bLevel = CONCAT13(1,(int3)bLevel);
            iVar4 = local_38;
            goto LAB_00135f27;
          }
        }
        Heap<Minisat::Solver::VarOrderLt>::insert
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      }
LAB_00135f27:
    } while ((bLevel & 0x1000000) != 0);
    if (0 < local_1c) {
      (in_RDI->restart).savedDecisions = (long)local_1c + (in_RDI->restart).savedDecisions;
      iVar4 = local_1c;
      iVar6 = decisionLevel((Solver *)0x135f70);
      if (iVar4 == iVar6) {
        local_a8 = vec<Minisat::Lit>::size(&in_RDI->trail);
      }
      else {
        piVar8 = vec<int>::operator[](&in_RDI->trail_lim,local_1c);
        local_a8 = *piVar8;
      }
      piVar8 = vec<int>::operator[](&in_RDI->trail_lim,0);
      (in_RDI->restart).savedPropagations =
           (long)(local_a8 - *piVar8) + (in_RDI->restart).savedPropagations;
      (in_RDI->restart).partialRestarts = (in_RDI->restart).partialRestarts + 1;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int Solver::getRestartLevel()
{
    // stay on the current level?
    if (restart.selection_type == 3) return decisionLevel();
    if (restart.selection_type == 4) return decisionLevel() == 0 ? 0 : rand() % decisionLevel();

    if (restart.selection_type >= 1) {

        bool repeatReusedTrail = false;
        Var next = var_Undef;
        int restartLevel = 0;

        const vec<double> &restart_activity = usesVSIDS() ? activity_VSIDS : (usesCHB() ? activity_CHB : activity_distance);

        do {
            repeatReusedTrail = false; // get it right this time?

            // Activity based selection
            while (next == var_Undef || value(next) != l_Undef ||
                   !decision[next]) // found a yet unassigned variable with the highest activity among the unassigned variables
                if (order_heap->empty()) {
                    // we cannot compare to any other variable, hence, we have SAT already
                    return 0;
                } else {
                    next = order_heap->removeMin(); // get next element
                }

            // based on variable next, either check for reusedTrail, or matching Trail!
            // activity of the next decision literal
            restartLevel = 0;
            for (int i = 0; i < decisionLevel(); ++i) {
                if (restart_activity[var(trail[trail_lim[i]])] < restart_activity[next]) {
                    restartLevel = i;
                    break;
                }
            }
            // put the decision literal back, so that it can be used for the next decision
            order_heap->insert(next);

            // reused trail
            if (restart.selection_type > 1 && restartLevel > 0) { // check whether jumping higher would be "more correct"
                cancelUntil(restartLevel);
                Var more = var_Undef;
                while (more == var_Undef || value(more) != l_Undef || !decision[more])
                    if (order_heap->empty()) {
                        more = var_Undef;
                        break;
                    } else {
                        more = order_heap->removeMin();
                    }

                // actually, would have to jump higher than the current level!
                if (more != var_Undef && restart_activity[more] > var(trail[trail_lim[restartLevel - 1]])) {
                    repeatReusedTrail = true;
                    next = more; // no need to insert, and get back afterwards again!
                } else {
                    order_heap->insert(more);
                }
            }
        } while (repeatReusedTrail);

        // stats
        if (restartLevel > 0) { // if a partial restart is done
            restart.savedDecisions += restartLevel;
            const int thisPropSize = restartLevel == decisionLevel() ? trail.size() : trail_lim[restartLevel];
            restart.savedPropagations += (thisPropSize - trail_lim[0]); // number of literals that do not need to be propagated
            restart.partialRestarts++;
        }

        // return restart level
        return restartLevel;
    }
    return 0;
}